

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O3

VkWriteDescriptorSetAccelerationStructureKHR * __thiscall
Diligent::ShaderResourceCacheVk::Resource::GetAccelerationStructureWriteInfo
          (VkWriteDescriptorSetAccelerationStructureKHR *__return_storage_ptr__,Resource *this)

{
  TopLevelASVkImpl *pTVar1;
  string msg;
  string local_38;
  
  if (this->Type != AccelerationStructure) {
    FormatString<char[44]>(&local_38,(char (*) [44])"Acceleration structure resource is expected");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetAccelerationStructureWriteInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x35b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->pObject).m_pObject == (IDeviceObject *)0x0) {
    FormatString<char[71]>
              (&local_38,
               (char (*) [71])
               "Unable to get acceleration structure write info: cached object is null");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetAccelerationStructureWriteInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x35c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  pTVar1 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::TopLevelASVkImpl>
                     (&this->pObject);
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET_ACCELERATION_STRUCTURE_KHR;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->accelerationStructureCount = 1;
  __return_storage_ptr__->pAccelerationStructures = &(pTVar1->m_VulkanTLAS).m_VkObject;
  return __return_storage_ptr__;
}

Assistant:

VkWriteDescriptorSetAccelerationStructureKHR ShaderResourceCacheVk::Resource::GetAccelerationStructureWriteInfo() const
{
    VERIFY(Type == DescriptorType::AccelerationStructure, "Acceleration structure resource is expected");
    DEV_CHECK_ERR(pObject != nullptr, "Unable to get acceleration structure write info: cached object is null");

    const TopLevelASVkImpl* pTLASVk = pObject.ConstPtr<TopLevelASVkImpl>();

    VkWriteDescriptorSetAccelerationStructureKHR DescrAS;
    DescrAS.sType                      = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET_ACCELERATION_STRUCTURE_KHR;
    DescrAS.pNext                      = nullptr;
    DescrAS.accelerationStructureCount = 1;
    DescrAS.pAccelerationStructures    = pTLASVk->GetVkTLASPtr();

    return DescrAS;
}